

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  Schema *pSVar1;
  Trigger *pTVar2;
  int iVar3;
  undefined8 *in_RSI;
  long *in_RDI;
  Trigger *pTrig;
  HashElem *p;
  Trigger *pList;
  Schema *pTmpSchema;
  HashElem *local_28;
  Trigger *local_20;
  
  pSVar1 = *(Schema **)(*(long *)(*in_RDI + 0x20) + 0x38);
  local_20 = (Trigger *)in_RSI[0xb];
  for (local_28 = (pSVar1->trigHash).first; local_28 != (HashElem *)0x0; local_28 = local_28->next)
  {
    pTVar2 = (Trigger *)local_28->data;
    if ((((pTVar2->pTabSchema == (Schema *)in_RSI[0xc]) && (pTVar2->table != (char *)0x0)) &&
        (iVar3 = sqlite3StrICmp(pTVar2->table,(char *)*in_RSI), iVar3 == 0)) &&
       ((pTVar2->pTabSchema != pSVar1 || (pTVar2->bReturning != '\0')))) {
      pTVar2->pNext = local_20;
      local_20 = pTVar2;
    }
    else if (pTVar2->op == 0x97) {
      pTVar2->table = (char *)*in_RSI;
      pTVar2->pTabSchema = (Schema *)in_RSI[0xc];
      pTVar2->pNext = local_20;
      local_20 = pTVar2;
    }
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema *pTmpSchema;       /* Schema of the pTab table */
  Trigger *pList;           /* List of triggers to return */
  HashElem *p;              /* Loop variable for TEMP triggers */

  assert( pParse->disableTriggers==0 );
  pTmpSchema = pParse->db->aDb[1].pSchema;
  p = sqliteHashFirst(&pTmpSchema->trigHash);
  pList = pTab->pTrigger;
  while( p ){
    Trigger *pTrig = (Trigger *)sqliteHashData(p);
    if( pTrig->pTabSchema==pTab->pSchema
     && pTrig->table
     && 0==sqlite3StrICmp(pTrig->table, pTab->zName)
     && (pTrig->pTabSchema!=pTmpSchema || pTrig->bReturning)
    ){
      pTrig->pNext = pList;
      pList = pTrig;
    }else if( pTrig->op==TK_RETURNING ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
      assert( pParse->db->pVtabCtx==0 );
#endif
      assert( pParse->bReturning );
      assert( &(pParse->u1.pReturning->retTrig) == pTrig );
      pTrig->table = pTab->zName;
      pTrig->pTabSchema = pTab->pSchema;
      pTrig->pNext = pList;
      pList = pTrig;
    }
    p = sqliteHashNext(p);
  }
#if 0
  if( pList ){
    Trigger *pX;
    printf("Triggers for %s:", pTab->zName);
    for(pX=pList; pX; pX=pX->pNext){
      printf(" %s", pX->zName);
    }
    printf("\n");
    fflush(stdout);
  }
#endif
  return pList;
}